

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O3

void Js::StringProfiler::PrintOneConcat(UintUintPair *key,ConcatMetrics *metrics)

{
  undefined1 auVar1 [16];
  
  PrintUintOrLarge(key->first);
  Output::Print(L" ");
  PrintUintOrLarge(key->second);
  Output::Print(L" %6u",(ulong)metrics->compoundStringCount);
  Output::Print(L" %6u",(ulong)metrics->concatTreeCount);
  Output::Print(L" %6u",(ulong)metrics->bufferStringBuilderCount);
  Output::Print(L" %6u",(ulong)metrics->unknownCount);
  auVar1 = phaddd((undefined1  [16])*metrics,(undefined1  [16])*metrics);
  auVar1 = phaddd(auVar1,auVar1);
  Output::Print(L" %6u\n",(ulong)auVar1._0_4_);
  return;
}

Assistant:

void StringProfiler::PrintOneConcat( UintUintPair const& key, const ConcatMetrics& metrics)
    {
        PrintUintOrLarge(key.first);
        Output::Print(_u(" "));
        PrintUintOrLarge(key.second);
        Output::Print(_u(" %6u"), metrics.compoundStringCount);
        Output::Print(_u(" %6u"), metrics.concatTreeCount);
        Output::Print(_u(" %6u"), metrics.bufferStringBuilderCount);
        Output::Print(_u(" %6u"), metrics.unknownCount);
        Output::Print(_u(" %6u\n"), metrics.Total());
    }